

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

void __thiscall QStackedLayout::hasHeightForWidth(QStackedLayout *this)

{
  hasHeightForWidth((QStackedLayout *)&this[-1].super_QLayout.super_QLayoutItem);
  return;
}

Assistant:

bool QStackedLayout::hasHeightForWidth() const
{
    const int n = count();

    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (item->hasHeightForWidth())
                return true;
        }
    }
    return false;
}